

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  int iVar1;
  LocVar *pLVar2;
  BlockCnt *pBVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  Upvaldesc *pUVar8;
  
  if (fs == (FuncState *)0x0) {
    return 0;
  }
  uVar5 = (uint)fs->nactvar;
  while (uVar4 = uVar5, 0 < (int)uVar4) {
    uVar5 = uVar4 - 1;
    pLVar2 = getlocvar(fs,uVar5);
    iVar1 = luaS_eqstr(n,pLVar2->varname);
    if (iVar1 != 0) {
      var->t = -1;
      var->f = -1;
      var->k = VLOCAL;
      (var->u).info = uVar5;
      if (base != 0) {
        return 7;
      }
      pBVar3 = (BlockCnt *)&fs->bl;
      do {
        pBVar3 = pBVar3->previous;
      } while ((int)uVar4 <= (int)(uint)pBVar3->nactvar);
      pBVar3->upval = '\x01';
      return 7;
    }
  }
  pUVar8 = fs->f->upvalues;
  for (uVar7 = 0; uVar7 < fs->nups; uVar7 = uVar7 + 1) {
    iVar1 = luaS_eqstr(pUVar8->name,n);
    if (iVar1 != 0) goto LAB_0010e0c3;
    pUVar8 = pUVar8 + 1;
  }
  iVar6 = 0;
  iVar1 = singlevaraux(fs->prev,n,var,0);
  if (iVar1 != 0) {
    uVar5 = newupvalue(fs,n,var);
    uVar7 = (ulong)uVar5;
LAB_0010e0c3:
    var->t = -1;
    var->f = -1;
    var->k = VUPVAL;
    (var->u).info = (int)uVar7;
    iVar6 = 8;
  }
  return iVar6;
}

Assistant:

static int singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    return VVOID;  /* default is global */
  else {
    int v = searchvar(fs, n);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      init_exp(var, VLOCAL, v);  /* variable is local */
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
      return VLOCAL;
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        if (singlevaraux(fs->prev, n, var, 0) == VVOID) /* try upper levels */
          return VVOID;  /* not found; is a global */
        /* else was LOCAL or UPVAL */
        idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
      }
      init_exp(var, VUPVAL, idx);
      return VUPVAL;
    }
  }
}